

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

ExprNode * __thiscall Parser::arithExpr(Parser *this)

{
  undefined8 uVar1;
  InfixExprNode *pIVar2;
  InfixExprNode *this_00;
  ExprNode **ppEVar3;
  ExprNode *pEVar4;
  Token op;
  undefined1 local_180 [32];
  _Alloc_hider local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  bool local_140;
  bool bStack_13f;
  bool bStack_13e;
  bool bStack_13d;
  bool bStack_13c;
  bool bStack_13b;
  char cStack_13a;
  undefined1 uStack_139;
  undefined4 uStack_138;
  undefined4 uStack_134;
  _Alloc_hider local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  undefined1 local_110 [32];
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  bool local_d0;
  bool bStack_cf;
  bool bStack_ce;
  bool bStack_cd;
  bool bStack_cc;
  bool bStack_cb;
  char cStack_ca;
  undefined1 uStack_c9;
  undefined8 uStack_c8;
  _Alloc_hider local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  undefined1 local_a0 [32];
  _Alloc_hider local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  bool local_60;
  bool bStack_5f;
  bool bStack_5e;
  bool bStack_5d;
  bool bStack_5c;
  bool bStack_5b;
  char cStack_5a;
  undefined1 uStack_59;
  double dStack_58;
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  pIVar2 = (InfixExprNode *)term(this);
  Tokenizer::getToken((Token *)local_110,this->tokenizer);
  while ((cStack_ca == '-' || (cStack_ca == '+'))) {
    this_00 = (InfixExprNode *)operator_new(0x90);
    local_180._0_8_ = local_180 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_180,local_110._0_8_,(pointer)(local_110._0_8_ + local_110._8_8_));
    local_160._M_p = (pointer)&local_150;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_160,local_f0._M_p,local_f0._M_p + local_e8);
    uVar1 = _local_d0;
    local_140 = local_d0;
    bStack_13f = bStack_cf;
    bStack_13e = bStack_ce;
    bStack_13d = bStack_cd;
    bStack_13c = bStack_cc;
    bStack_13b = bStack_cb;
    cStack_13a = cStack_ca;
    uStack_139 = uStack_c9;
    uStack_138 = (undefined4)uStack_c8;
    uStack_134 = uStack_c8._4_4_;
    local_130._M_p = (pointer)&local_120;
    _local_d0 = uVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,local_c0._M_p,local_c0._M_p + local_b8);
    InfixExprNode::InfixExprNode(this_00,(Token *)local_180);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_p != &local_120) {
      operator_delete(local_130._M_p,local_120._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_p != &local_150) {
      operator_delete(local_160._M_p,local_150._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
      operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
    }
    ppEVar3 = InfixExprNode::left(this_00);
    *ppEVar3 = &pIVar2->super_ExprNode;
    pEVar4 = term(this);
    ppEVar3 = InfixExprNode::right(this_00);
    *ppEVar3 = pEVar4;
    Tokenizer::getToken((Token *)local_a0,this->tokenizer);
    std::__cxx11::string::operator=((string *)local_110,(string *)local_a0);
    std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_80);
    local_d0 = local_60;
    bStack_cf = bStack_5f;
    bStack_ce = bStack_5e;
    bStack_cd = bStack_5d;
    bStack_cc = bStack_5c;
    bStack_cb = bStack_5b;
    cStack_ca = cStack_5a;
    uStack_c9 = uStack_59;
    uStack_c8 = dStack_58;
    std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_p != &local_70) {
      operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
    }
    pIVar2 = this_00;
    if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
      operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
    }
  }
  Tokenizer::ungetToken(this->tokenizer);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_p != &local_b0) {
    operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_p != &local_e0) {
    operator_delete(local_f0._M_p,local_e0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
    operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
  }
  return &pIVar2->super_ExprNode;
}

Assistant:

ExprNode *Parser::arithExpr() {
    // arith_expr: term { ( + | - ) term}*

    ExprNode *left = term();
    Token op = tokenizer.getToken();
    while (op.isArithmeticOperator()) {
        auto *p = new InfixExprNode(op);
        p->left() = left;
        p->right() = term();
        left = p;
        op = tokenizer.getToken();
    }
    tokenizer.ungetToken();
    return left;
}